

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeyore_optim_commonexp.cpp
# Opt level: O2

void __thiscall persistent_umap<ee_lval,_int>::restore(persistent_umap<ee_lval,_int> *this,int at)

{
  mapped_type mVar1;
  pointer ppVar2;
  mapped_type *pmVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)(int)((ulong)((long)(this->record).
                                    super__Vector_base<std::pair<ee_lval,_std::optional<int>_>,_std::allocator<std::pair<ee_lval,_std::optional<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->record).
                                   super__Vector_base<std::pair<ee_lval,_std::optional<int>_>,_std::allocator<std::pair<ee_lval,_std::optional<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
  lVar4 = lVar5 << 5;
  for (; at < lVar5; lVar5 = lVar5 + -1) {
    ppVar2 = (this->record).
             super__Vector_base<std::pair<ee_lval,_std::optional<int>_>,_std::allocator<std::pair<ee_lval,_std::optional<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(char *)((long)&ppVar2[-1].second.super__Optional_base<int,_true,_true>._M_payload +
                 lVar4 + 4) == '\x01') {
      mVar1 = *(mapped_type *)
               ((long)&ppVar2[-1].second.super__Optional_base<int,_true,_true>._M_payload + lVar4);
      pmVar3 = std::__detail::
               _Map_base<ee_lval,_std::pair<const_ee_lval,_int>,_std::allocator<std::pair<const_ee_lval,_int>_>,_std::__detail::_Select1st,_std::equal_to<ee_lval>,_std::hash<ee_lval>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<ee_lval,_std::pair<const_ee_lval,_int>,_std::allocator<std::pair<const_ee_lval,_int>_>,_std::__detail::_Select1st,_std::equal_to<ee_lval>,_std::hash<ee_lval>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,(key_type *)((long)&ppVar2[-1].first.sym.type + lVar4));
      *pmVar3 = mVar1;
    }
    else {
      std::
      _Hashtable<ee_lval,_std::pair<const_ee_lval,_int>,_std::allocator<std::pair<const_ee_lval,_int>_>,_std::__detail::_Select1st,_std::equal_to<ee_lval>,_std::hash<ee_lval>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<ee_lval,_std::pair<const_ee_lval,_int>,_std::allocator<std::pair<const_ee_lval,_int>_>,_std::__detail::_Select1st,_std::equal_to<ee_lval>,_std::hash<ee_lval>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this);
    }
    lVar4 = lVar4 + -0x20;
  }
  return;
}

Assistant:

inline void restore(int at) {
    for(int i = (int)record.size() - 1; i >= at; --i) {
      if(record[i].second) map[record[i].first] = *record[i].second;
      else map.erase(record[i].first);
    }
  }